

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# str_cat.cc
# Opt level: O0

void absl::StrAppend(Nonnull<std::string_*> dest,AlphaNum *a,AlphaNum *b,AlphaNum *c)

{
  bool bVar1;
  size_type sVar2;
  Nullable<const_char_*> pcVar3;
  long lVar4;
  ulong uVar5;
  ulong uVar6;
  size_type sVar7;
  string *dest_00;
  Nonnull<char_*> pcVar8;
  long lVar9;
  ulong in_RDI;
  char *out;
  char *begin;
  size_type old_size;
  AlphaNum *in_stack_ffffffffffffff78;
  Nullable<const_char_*> in_stack_ffffffffffffff80;
  
  sVar2 = AlphaNum::size((AlphaNum *)0x3b7dd4);
  bVar1 = true;
  if (sVar2 != 0) {
    pcVar3 = AlphaNum::data((AlphaNum *)0x3b7df0);
    lVar4 = std::__cxx11::string::data();
    uVar5 = std::__cxx11::string::size();
    bVar1 = uVar5 < (ulong)((long)pcVar3 - lVar4);
  }
  if (!bVar1) {
    __assert_fail("((a).size() == 0) || (uintptr_t((a).data() - (*dest).data()) > uintptr_t((*dest).size()))"
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/google[P]bloaty/third_party/abseil-cpp/absl/strings/str_cat.cc"
                  ,0xd3,
                  "void absl::StrAppend(absl::Nonnull<std::string *>, const AlphaNum &, const AlphaNum &, const AlphaNum &)"
                 );
  }
  sVar2 = AlphaNum::size((AlphaNum *)0x3b7e69);
  bVar1 = true;
  if (sVar2 != 0) {
    pcVar3 = AlphaNum::data((AlphaNum *)0x3b7e85);
    lVar4 = std::__cxx11::string::data();
    uVar5 = std::__cxx11::string::size();
    bVar1 = uVar5 < (ulong)((long)pcVar3 - lVar4);
  }
  if (!bVar1) {
    __assert_fail("((b).size() == 0) || (uintptr_t((b).data() - (*dest).data()) > uintptr_t((*dest).size()))"
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/google[P]bloaty/third_party/abseil-cpp/absl/strings/str_cat.cc"
                  ,0xd4,
                  "void absl::StrAppend(absl::Nonnull<std::string *>, const AlphaNum &, const AlphaNum &, const AlphaNum &)"
                 );
  }
  sVar2 = AlphaNum::size((AlphaNum *)0x3b7efe);
  bVar1 = true;
  if (sVar2 != 0) {
    in_stack_ffffffffffffff80 = AlphaNum::data((AlphaNum *)0x3b7f1a);
    lVar4 = std::__cxx11::string::data();
    uVar5 = (long)in_stack_ffffffffffffff80 - lVar4;
    uVar6 = std::__cxx11::string::size();
    bVar1 = uVar6 < uVar5;
  }
  if (!bVar1) {
    __assert_fail("((c).size() == 0) || (uintptr_t((c).data() - (*dest).data()) > uintptr_t((*dest).size()))"
                  ,
                  "/workspace/llm4binary/github/license_c_cmakelists/google[P]bloaty/third_party/abseil-cpp/absl/strings/str_cat.cc"
                  ,0xd5,
                  "void absl::StrAppend(absl::Nonnull<std::string *>, const AlphaNum &, const AlphaNum &, const AlphaNum &)"
                 );
  }
  std::__cxx11::string::size();
  sVar2 = AlphaNum::size((AlphaNum *)0x3b7fb5);
  sVar7 = AlphaNum::size((AlphaNum *)0x3b7fc6);
  dest_00 = (string *)(sVar2 + sVar7);
  AlphaNum::size((AlphaNum *)0x3b7fe2);
  anon_unknown_5::STLStringAppendUninitializedAmortized(dest_00,sVar2);
  lVar4 = std::__cxx11::string::operator[](in_RDI);
  anon_unknown_5::Append(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
  anon_unknown_5::Append(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
  pcVar8 = anon_unknown_5::Append(in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
  lVar9 = std::__cxx11::string::size();
  if (pcVar8 == (Nonnull<char_*>)(lVar4 + lVar9)) {
    return;
  }
  __assert_fail("out == begin + dest->size()",
                "/workspace/llm4binary/github/license_c_cmakelists/google[P]bloaty/third_party/abseil-cpp/absl/strings/str_cat.cc"
                ,0xdd,
                "void absl::StrAppend(absl::Nonnull<std::string *>, const AlphaNum &, const AlphaNum &, const AlphaNum &)"
               );
}

Assistant:

void StrAppend(absl::Nonnull<std::string*> dest, const AlphaNum& a,
               const AlphaNum& b, const AlphaNum& c) {
  ASSERT_NO_OVERLAP(*dest, a);
  ASSERT_NO_OVERLAP(*dest, b);
  ASSERT_NO_OVERLAP(*dest, c);
  std::string::size_type old_size = dest->size();
  STLStringAppendUninitializedAmortized(dest, a.size() + b.size() + c.size());
  char* const begin = &(*dest)[0];
  char* out = begin + old_size;
  out = Append(out, a);
  out = Append(out, b);
  out = Append(out, c);
  assert(out == begin + dest->size());
}